

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

bool __thiscall QTextStreamPrivate::fillReadBuffer(QTextStreamPrivate *this,qint64 maxBytes)

{
  char16_t cVar1;
  QIODevice *this_00;
  QByteArrayView ba;
  bool bVar2;
  longlong *plVar3;
  qsizetype qVar4;
  QChar *pQVar5;
  QString *pQVar6;
  size_t in_RCX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  QChar *endPtr;
  QChar *readPtr;
  QChar *writePtr;
  qsizetype oldReadBufferSize;
  qint64 bytesRead;
  bool textModeEnabled;
  QChar ch;
  QChar CR;
  char buf [16384];
  undefined7 in_stack_ffffffffffffbf38;
  undefined1 in_stack_ffffffffffffbf3f;
  QString *in_stack_ffffffffffffbf40;
  undefined7 in_stack_ffffffffffffbf48;
  undefined1 in_stack_ffffffffffffbf4f;
  QIODevice *in_stack_ffffffffffffbf50;
  EncodedData<QByteArrayView> *in_stack_ffffffffffffbf68;
  long local_4088;
  QString *local_4078;
  QString *local_4070;
  long local_4060;
  bool local_4045;
  QChar local_4042 [21];
  longlong local_4018;
  long local_4010;
  EncodedData<QByteArrayView> local_4008 [682];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4010 = in_RSI;
  bVar2 = QIODevice::isTextModeEnabled((QIODevice *)0x13e03b);
  if (bVar2) {
    QIODevice::setTextModeEnabled(in_stack_ffffffffffffbf50,(bool)in_stack_ffffffffffffbf4f);
  }
  memset(local_4008,0xaa,0x4000);
  if (local_4010 == -1) {
    local_4060 = QIODevice::read((QIODevice *)(in_RDI->d).d,(int)local_4008,(void *)0x4000,in_RCX);
  }
  else {
    this_00 = (QIODevice *)(in_RDI->d).d;
    in_stack_ffffffffffffbf68 = local_4008;
    local_4018 = 0x4000;
    plVar3 = qMin<long_long>(&local_4018,&local_4010);
    local_4060 = QIODevice::read(this_00,(int)in_stack_ffffffffffffbf68,(void *)*plVar3,in_RCX);
  }
  if (bVar2) {
    QIODevice::setTextModeEnabled(in_stack_ffffffffffffbf50,(bool)in_stack_ffffffffffffbf4f);
  }
  if (local_4060 < 1) {
    local_4045 = false;
  }
  else {
    local_4088 = QString::size((QString *)&in_RDI[9].d.ptr);
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)in_stack_ffffffffffffbf50,
               (char *)CONCAT17(in_stack_ffffffffffffbf4f,in_stack_ffffffffffffbf48),
               (qsizetype)in_stack_ffffffffffffbf40);
    ba.m_data._0_7_ = in_stack_ffffffffffffbf48;
    ba.m_size = (qsizetype)in_stack_ffffffffffffbf40;
    ba.m_data._7_1_ = in_stack_ffffffffffffbf4f;
    QStringDecoder::operator()
              ((QStringDecoder *)CONCAT17(in_stack_ffffffffffffbf3f,in_stack_ffffffffffffbf38),ba);
    operator+=(in_RDI,in_stack_ffffffffffffbf68);
    qVar4 = QString::size((QString *)&in_RDI[9].d.ptr);
    if ((local_4088 < qVar4) && (bVar2)) {
      local_4042[0].ucs = L'ꪪ';
      QChar::QChar<char16_t,_true>(local_4042,L'\r');
      pQVar5 = QString::data(in_stack_ffffffffffffbf40);
      local_4070 = (QString *)(pQVar5 + local_4088);
      pQVar5 = QString::data(in_stack_ffffffffffffbf40);
      local_4078 = (QString *)(pQVar5 + local_4088);
      pQVar5 = QString::data(in_stack_ffffffffffffbf40);
      qVar4 = QString::size((QString *)&in_RDI[9].d.ptr);
      pQVar6 = (QString *)(pQVar5 + qVar4);
      if (local_4078 < pQVar6) {
        do {
          local_4078 = (QString *)((long)&(local_4078->d).d + 2);
          bVar2 = ::operator!=((QChar *)in_stack_ffffffffffffbf40,
                               (QChar *)CONCAT17(in_stack_ffffffffffffbf3f,in_stack_ffffffffffffbf38
                                                ));
          if (!bVar2) break;
          local_4088 = local_4088 + 1;
          local_4070 = (QString *)((long)&(local_4070->d).d + 2);
        } while (local_4070 != pQVar6);
      }
      while (local_4078 < pQVar6) {
        cVar1 = *(char16_t *)&(local_4078->d).d;
        bVar2 = ::operator!=((QChar *)in_stack_ffffffffffffbf40,
                             (QChar *)CONCAT17(in_stack_ffffffffffffbf3f,in_stack_ffffffffffffbf38))
        ;
        if (bVar2) {
          *(char16_t *)&(local_4070->d).d = cVar1;
          local_4070 = (QString *)((long)&(local_4070->d).d + 2);
        }
        else if (local_4088 < (long)in_RDI[10].d.ptr) {
          in_RDI[10].d.ptr = (char16_t *)((long)in_RDI[10].d.ptr + -1);
        }
        local_4088 = local_4088 + 1;
        local_4078 = (QString *)((long)&(local_4078->d).d + 2);
      }
      QString::data(local_4070);
      QString::resize(local_4070,CONCAT17(in_stack_ffffffffffffbf3f,in_stack_ffffffffffffbf38));
    }
    local_4045 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4045;
}

Assistant:

bool QTextStreamPrivate::fillReadBuffer(qint64 maxBytes)
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    Q_ASSERT(!string);
    Q_ASSERT(device);

    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled)
        device->setTextModeEnabled(false);

    // read raw data into a temporary buffer
    char buf[QTEXTSTREAM_BUFFERSIZE];
    qint64 bytesRead = 0;
#if defined(Q_OS_WIN)
    // On Windows, there is no non-blocking stdin - so we fall back to reading
    // lines instead. If there is no QOBJECT, we read lines for all sequential
    // devices; otherwise, we read lines only for stdin.
    QFile *file = 0;
    Q_UNUSED(file);
    if (device->isSequential()
#if !defined(QT_NO_QOBJECT)
        && (file = qobject_cast<QFile *>(device)) && file->handle() == 0
#endif
        ) {
        if (maxBytes != -1)
            bytesRead = device->readLine(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->readLine(buf, sizeof(buf));
    } else
#endif
    {
        if (maxBytes != -1)
            bytesRead = device->read(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->read(buf, sizeof(buf));
    }

    // reset the Text flag.
    if (textModeEnabled)
        device->setTextModeEnabled(true);

    if (bytesRead <= 0)
        return false;

#ifndef QT_BOOTSTRAPPED
    if (autoDetectUnicode) {
        autoDetectUnicode = false;

        auto e = QStringConverter::encodingForData(QByteArrayView(buf, bytesRead));
        // QStringConverter::Locale implies unknown, so keep the current encoding
        if (e) {
            encoding = *e;
            toUtf16 = QStringDecoder(encoding);
            fromUtf16 = QStringEncoder(encoding);
        }
    }
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), using %s encoding", QStringConverter::nameForEncoding(encoding));
#endif
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), device->read(\"%s\", %d) == %d",
           QtDebugUtils::toPrintable(buf, bytesRead, 32).constData(),
           int(sizeof(buf)), int(bytesRead));
#endif

    qsizetype oldReadBufferSize = readBuffer.size();
    readBuffer += toUtf16(QByteArrayView(buf, bytesRead));

    // remove all '\r\n' in the string.
    if (readBuffer.size() > oldReadBufferSize && textModeEnabled) {
        QChar CR = u'\r';
        QChar *writePtr = readBuffer.data() + oldReadBufferSize;
        QChar *readPtr = readBuffer.data() + oldReadBufferSize;
        QChar *endPtr = readBuffer.data() + readBuffer.size();

        qsizetype n = oldReadBufferSize;
        if (readPtr < endPtr) {
            // Cut-off to avoid unnecessary self-copying.
            while (*readPtr++ != CR) {
                ++n;
                if (++writePtr == endPtr)
                    break;
            }
        }
        while (readPtr < endPtr) {
            QChar ch = *readPtr++;
            if (ch != CR) {
                *writePtr++ = ch;
            } else {
                if (n < readBufferOffset)
                    --readBufferOffset;
                --bytesRead;
            }
            ++n;
        }
        readBuffer.resize(writePtr - readBuffer.data());
    }

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer() read %d bytes from device. readBuffer = [%s]",
           int(bytesRead),
           QtDebugUtils::toPrintable(readBuffer.toLatin1(), readBuffer.size(),
                                     readBuffer.size()).constData());
#endif
    return true;
}